

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

LiteralNumber * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,char_const(&)[4]>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,char (*args_2) [4])

{
  LiteralNumber *this_00;
  allocator<char> local_49;
  string local_48;
  
  this_00 = (LiteralNumber *)operator_new(0xa8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,*args_2,&local_49);
  LiteralNumber::LiteralNumber(this_00,args,args_1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_48._M_dataplus._M_p = (pointer)this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_48);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }